

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

CoatedConductorMaterial * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::CoatedConductorMaterial,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::Image*&,bool&,pbrt::LayeredBxDFConfig&>
          (polymorphic_allocator<std::byte> *this,FloatTextureHandle *args,
          FloatTextureHandle *args_1,FloatTextureHandle *args_2,FloatTextureHandle *args_3,
          FloatTextureHandle *args_4,SpectrumTextureHandle *args_5,FloatTextureHandle *args_6,
          FloatTextureHandle *args_7,SpectrumTextureHandle *args_8,SpectrumTextureHandle *args_9,
          SpectrumTextureHandle *args_10,FloatTextureHandle *args_11,Image **args_12,bool *args_13,
          LayeredBxDFConfig *args_14)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x70,8);
  construct<pbrt::CoatedConductorMaterial,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::Image*&,bool&,pbrt::LayeredBxDFConfig&>
            (this,(CoatedConductorMaterial *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,
             args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,args_12,args_13,args_14);
  return (CoatedConductorMaterial *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }